

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O2

void priBaseMod(word *mods,word *a,size_t n,size_t count)

{
  size_t sVar1;
  word wVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  word *pwVar6;
  
  uVar5 = 0;
  for (uVar3 = 0; (uVar5 < count && (uVar3 < 0xc6)); uVar3 = uVar3 + 1) {
    sVar1 = _prods[uVar3].num;
    wVar2 = zzModW(a,n,_prods[uVar3].prod);
    for (sVar4 = 0; (sVar1 != sVar4 && (sVar4 + uVar5 < count)); sVar4 = sVar4 + 1) {
      mods[uVar5 + sVar4] = wVar2 % _base[sVar4 + uVar5];
    }
    uVar5 = sVar4 + uVar5;
  }
  pwVar6 = _base + uVar5;
  for (; uVar5 < count; uVar5 = uVar5 + 1) {
    wVar2 = zzModW(a,n,*pwVar6);
    mods[uVar5] = wVar2;
    pwVar6 = pwVar6 + 1;
  }
  return;
}

Assistant:

void priBaseMod(word mods[], const word a[], size_t n, size_t count)
{
	size_t i, j;
	// pre
	ASSERT(wwIsValid(a, n));
	ASSERT(count <= priBaseSize());
	ASSERT(wwIsValid(mods, count));
	// пробегаем произведения простых из факторной базы
	for (i = j = 0; i < count && j < COUNT_OF(_prods); ++j)
	{
		size_t num = _prods[j].num;
		// t <- a mod _base[i] * ... * _base[i + num - 1]
		word t = zzModW(a, n, _prods[j].prod);
		// mods[i] <- t mod _base[i]
		while (num-- && i < count)
			mods[i] = t % _base[i], ++i;
	}
	// пробегаем оставшиеся простые из факторной базы
	for (; i < count; ++i)
		mods[i] = zzModW(a, n, _base[i]);
}